

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_DXT.c
# Opt level: O1

uchar * convert_image_to_DXT1(uchar *uncompressed,int width,int height,int channels,int *out_size)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uchar *puVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  uchar *puVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  uchar cblock [8];
  uchar ublock [48];
  int local_e8;
  undefined8 local_70;
  uchar local_68 [56];
  
  *out_size = 0;
  if (channels - 5U < 0xfffffffc || (uncompressed == (uchar *)0x0 || (height < 1 || width < 1))) {
    puVar5 = (uchar *)0x0;
  }
  else {
    uVar11 = (uint)(2 < channels);
    uVar12 = (width * 2 + 6U & 0xfffffff8) * (height + 3U >> 2);
    *out_size = uVar12;
    puVar5 = (uchar *)malloc((ulong)uVar12);
    iVar10 = 0;
    iVar13 = channels * width;
    iVar14 = iVar13 * 4;
    iVar1 = channels * 4;
    iVar20 = (uint)(2 < channels) * 2;
    iVar15 = 0;
    iVar22 = 0;
    do {
      iVar3 = height - iVar15;
      if (iVar15 + 4 < height) {
        iVar3 = 4;
      }
      iVar6 = -1;
      iVar17 = 4;
      iVar8 = 0;
      iVar24 = iVar20;
      local_e8 = iVar10;
      uVar12 = uVar11;
      do {
        iVar16 = iVar17;
        if (width < iVar17) {
          iVar16 = width;
        }
        iVar9 = width - iVar8;
        iVar8 = iVar8 + 4;
        if (iVar8 < width) {
          iVar9 = 4;
        }
        if (iVar3 < 1) {
          iVar4 = 0;
        }
        else {
          lVar18 = 0;
          iVar4 = 0;
          iVar23 = local_e8;
          iVar21 = iVar24;
          uVar19 = uVar12;
          do {
            if (0 < iVar9) {
              puVar25 = local_68 + (long)iVar4 + 2;
              lVar7 = 0;
              iVar28 = iVar23;
              iVar26 = iVar21;
              uVar27 = uVar19;
              do {
                puVar25[-2] = uncompressed[iVar28];
                puVar25[-1] = uncompressed[(int)uVar27];
                *puVar25 = uncompressed[iVar26];
                lVar7 = lVar7 + 1;
                iVar28 = iVar28 + channels;
                iVar26 = iVar26 + channels;
                uVar27 = uVar27 + channels;
                puVar25 = puVar25 + 3;
                iVar4 = iVar4 + 3;
              } while (lVar7 < iVar9);
            }
            if (iVar9 < 4) {
              puVar25 = local_68 + (long)iVar4 + 2;
              iVar28 = iVar16 + iVar6;
              do {
                puVar25[-2] = local_68[0];
                puVar25[-1] = local_68[1];
                *puVar25 = local_68[2];
                puVar25 = puVar25 + 3;
                iVar4 = iVar4 + 3;
                iVar28 = iVar28 + 1;
              } while (iVar28 < 3);
            }
            lVar18 = lVar18 + 1;
            iVar23 = iVar23 + iVar13;
            iVar21 = iVar21 + iVar13;
            uVar19 = uVar19 + iVar13;
          } while (lVar18 < iVar3);
        }
        iVar16 = iVar3;
        if (iVar3 < 4) {
          do {
            lVar18 = (long)iVar4;
            lVar7 = 0;
            do {
              local_68[lVar7 + lVar18] = local_68[0];
              local_68[lVar7 + lVar18 + 1] = local_68[1];
              local_68[lVar7 + lVar18 + 2] = local_68[2];
              lVar7 = lVar7 + 3;
            } while ((int)lVar7 != 0xc);
            iVar4 = iVar4 + 0xc;
            bVar2 = iVar16 < 3;
            iVar16 = iVar16 + 1;
          } while (bVar2);
        }
        compress_DDS_color_block(3,local_68,(uchar *)&local_70);
        *(undefined8 *)(puVar5 + iVar22) = local_70;
        iVar22 = iVar22 + 8;
        local_e8 = local_e8 + iVar1;
        iVar24 = iVar24 + iVar1;
        uVar12 = uVar12 + iVar1;
        iVar17 = iVar17 + 4;
        iVar6 = iVar6 + -4;
      } while (iVar8 < width);
      iVar15 = iVar15 + 4;
      iVar10 = iVar10 + iVar14;
      iVar20 = iVar20 + iVar14;
      uVar11 = uVar11 + iVar14;
    } while (iVar15 < height);
  }
  return puVar5;
}

Assistant:

unsigned char* convert_image_to_DXT1(
		const unsigned char *const uncompressed,
		int width, int height, int channels,
		int *out_size )
{
	unsigned char *compressed;
	int i, j, x, y;
	unsigned char ublock[16*3];
	unsigned char cblock[8];
	int index = 0, chan_step = 1;
	int block_count = 0;
	/*	error check	*/
	*out_size = 0;
	if( (width < 1) || (height < 1) ||
		(NULL == uncompressed) ||
		(channels < 1) || (channels > 4) )
	{
		return NULL;
	}
	/*	for channels == 1 or 2, I do not step forward for R,G,B values	*/
	if( channels < 3 )
	{
		chan_step = 0;
	}
	/*	get the RAM for the compressed image
		(8 bytes per 4x4 pixel block)	*/
	*out_size = ((width+3) >> 2) * ((height+3) >> 2) * 8;
	compressed = (unsigned char*)malloc( *out_size );
	/*	go through each block	*/
	for( j = 0; j < height; j += 4 )
	{
		for( i = 0; i < width; i += 4 )
		{
			/*	copy this block into a new one	*/
			int idx = 0;
			int mx = 4, my = 4;
			if( j+4 >= height )
			{
				my = height - j;
			}
			if( i+4 >= width )
			{
				mx = width - i;
			}
			for( y = 0; y < my; ++y )
			{
				for( x = 0; x < mx; ++x )
				{
					ublock[idx++] = uncompressed[(j+y)*width*channels+(i+x)*channels];
					ublock[idx++] = uncompressed[(j+y)*width*channels+(i+x)*channels+chan_step];
					ublock[idx++] = uncompressed[(j+y)*width*channels+(i+x)*channels+chan_step+chan_step];
				}
				for( x = mx; x < 4; ++x )
				{
					ublock[idx++] = ublock[0];
					ublock[idx++] = ublock[1];
					ublock[idx++] = ublock[2];
				}
			}
			for( y = my; y < 4; ++y )
			{
				for( x = 0; x < 4; ++x )
				{
					ublock[idx++] = ublock[0];
					ublock[idx++] = ublock[1];
					ublock[idx++] = ublock[2];
				}
			}
			/*	compress the block	*/
			++block_count;
			compress_DDS_color_block( 3, ublock, cblock );
			/*	copy the data from the block into the main block	*/
			for( x = 0; x < 8; ++x )
			{
				compressed[index++] = cblock[x];
			}
		}
	}
	return compressed;
}